

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t update_current_filesystem(archive_read_disk *a,int64_t dev)

{
  int iVar1;
  tree *ptVar2;
  int iVar3;
  filesystem *pfVar4;
  void *p;
  size_t s;
  wchar_t fid;
  wchar_t i;
  tree *t;
  int64_t dev_local;
  archive_read_disk *a_local;
  
  ptVar2 = a->tree;
  if ((ptVar2->current_filesystem == (filesystem *)0x0) || (ptVar2->current_filesystem->dev != dev))
  {
    for (s._4_4_ = 0; s._4_4_ < ptVar2->max_filesystem_id; s._4_4_ = s._4_4_ + 1) {
      if (ptVar2->filesystem_table[s._4_4_].dev == dev) {
        ptVar2->current_filesystem_id = s._4_4_;
        ptVar2->current_filesystem = ptVar2->filesystem_table + s._4_4_;
        return L'\0';
      }
    }
    iVar1 = ptVar2->max_filesystem_id;
    ptVar2->max_filesystem_id = iVar1 + 1;
    if (ptVar2->allocated_filesytem < ptVar2->max_filesystem_id) {
      iVar3 = ptVar2->max_filesystem_id << 1;
      pfVar4 = (filesystem *)realloc(ptVar2->filesystem_table,(long)iVar3 * 0x58);
      if (pfVar4 == (filesystem *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate tar data");
        return L'\xffffffe2';
      }
      ptVar2->filesystem_table = pfVar4;
      ptVar2->allocated_filesytem = iVar3;
    }
    ptVar2->current_filesystem_id = iVar1;
    ptVar2->current_filesystem = ptVar2->filesystem_table + iVar1;
    ptVar2->current_filesystem->dev = dev;
    ptVar2->current_filesystem->allocation_ptr = (uchar *)0x0;
    ptVar2->current_filesystem->buff = (uchar *)0x0;
    a_local._4_4_ = setup_current_filesystem(a);
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
update_current_filesystem(struct archive_read_disk *a, int64_t dev)
{
	struct tree *t = a->tree;
	int i, fid;

	if (t->current_filesystem != NULL &&
	    t->current_filesystem->dev == dev)
		return (ARCHIVE_OK);

	for (i = 0; i < t->max_filesystem_id; i++) {
		if (t->filesystem_table[i].dev == dev) {
			/* There is the filesytem ID we've already generated. */
			t->current_filesystem_id = i;
			t->current_filesystem = &(t->filesystem_table[i]);
			return (ARCHIVE_OK);
		}
	}

	/*
	 * This is the new filesytem which we have to generate a new ID for.
	 */
	fid = t->max_filesystem_id++;
	if (t->max_filesystem_id > t->allocated_filesytem) {
		size_t s;
		void *p;

		s = t->max_filesystem_id * 2;
		p = realloc(t->filesystem_table,
		        s * sizeof(*t->filesystem_table));
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate tar data");
			return (ARCHIVE_FATAL);
		}
		t->filesystem_table = (struct filesystem *)p;
		t->allocated_filesytem = s;
	}
	t->current_filesystem_id = fid;
	t->current_filesystem = &(t->filesystem_table[fid]);
	t->current_filesystem->dev = dev;
	t->current_filesystem->allocation_ptr = NULL;
	t->current_filesystem->buff = NULL;

	/* Setup the current filesystem properties which depend on
	 * platform specific. */
	return (setup_current_filesystem(a));
}